

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O0

void qt_scale_image_argb32_on_argb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int srch,QRectF *targetRect,
               QRectF *sourceRect,QRect *clip,int const_alpha)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  unsigned_long_long *puVar23;
  ulong *puVar24;
  undefined8 *puVar25;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  QRectF *in_R9;
  long in_FS_OFFSET;
  qreal qVar26;
  qreal qVar27;
  qreal qVar28;
  qreal qVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ulong uVar35;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ulong uVar43;
  ushort uVar47;
  QRectF *in_stack_00000008;
  int in_stack_00000018;
  uint s_1;
  int _i;
  __m128i result;
  __m128i pixelVectorRB;
  __m128i pixelVectorAG;
  __m128i destMultipliedByOneMinusAlpha;
  __m128i dstVector;
  __m128i alphaChannel;
  __m128i srcVectorAlpha;
  __m128i srcVector;
  int idx3;
  int idx2;
  int idx1;
  int idx0;
  __m128i srcxVector;
  uint s;
  int x;
  int srcx;
  uint *src;
  int xend;
  int yend;
  int xstart;
  int ystart;
  __m128i ixVector;
  __m128i alphaMask;
  __m128i colorMask;
  __m128i one;
  __m128i half;
  __m128i nullVector;
  quint32 *dst;
  int dsty_1;
  int dsty;
  int dstx_1;
  int dstx;
  quint32 srcy;
  quint32 basex;
  int w;
  int h;
  int ty1;
  int tx1;
  int iy;
  int ix;
  qreal sy;
  qreal sx;
  QRect tr;
  QRect *in_stack_fffffffffffff968;
  QRect *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  int in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  undefined4 in_stack_fffffffffffff998;
  undefined2 in_stack_fffffffffffff99c;
  undefined2 in_stack_fffffffffffff99e;
  undefined8 in_stack_fffffffffffff9a0;
  uchar *in_stack_fffffffffffff9a8;
  QRectF *in_stack_fffffffffffff9d0;
  QRect *in_stack_fffffffffffff9d8;
  double dVar48;
  int in_stack_fffffffffffff9e0;
  int local_60c;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_578;
  undefined8 uStack_570;
  int local_558;
  uint local_554;
  ulong local_4d8;
  uint local_4c0;
  uint local_4bc;
  int local_4b8;
  int local_4b4;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  ushort local_308;
  ushort uStack_306;
  ushort uStack_304;
  ushort uStack_300;
  ushort uStack_2fc;
  ushort local_278;
  ushort uStack_276;
  ushort uStack_274;
  ushort uStack_272;
  ushort uStack_270;
  ushort uStack_26e;
  ushort uStack_26c;
  ushort uStack_26a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  char local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char local_178;
  char cStack_177;
  char cStack_176;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  ulong local_58;
  unsigned_long_long local_50;
  QRect local_48;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_stack_00000018 == 0x100) {
    qVar26 = QRectF::width(in_stack_00000008);
    qVar27 = QRectF::width(in_R9);
    qVar28 = QRectF::height(in_stack_00000008);
    qVar29 = QRectF::height(in_R9);
    iVar12 = (int)((qVar26 / qVar27) * 65536.0);
    iVar13 = (int)((qVar28 / qVar29) * 65536.0);
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRectF::normalized();
    local_18 = (undefined1  [16])
               QRectF::toRect((QRectF *)
                              CONCAT26(in_stack_fffffffffffff99e,
                                       CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                                      ));
    local_48 = QRect::intersected(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_18 = (undefined1  [16])local_48;
    bVar11 = QRect::isEmpty(in_stack_fffffffffffff970);
    if (!bVar11) {
      iVar14 = QRect::left((QRect *)0x9b5f7e);
      iVar15 = QRect::top((QRect *)0x9b5f92);
      local_4b4 = QRect::height(in_stack_fffffffffffff968);
      local_4b8 = QRect::width(in_stack_fffffffffffff968);
      if (0.0 <= qVar26 / qVar27) {
        QRectF::left(in_R9);
        iVar16 = qCeil<double>(5.03100476087052e-317);
        qVar26 = QRectF::left(in_stack_00000008);
        local_4bc = (int)(long)(qVar26 * 65536.0) + iVar16 + -1;
      }
      else {
        QRectF::right(in_R9);
        dVar48 = 65536.0;
        iVar16 = qFloor<double>(5.03093312135187e-317);
        qVar26 = QRectF::right(in_stack_00000008);
        local_4bc = (int)(long)(qVar26 * dVar48) + iVar16 + 1;
      }
      if (0.0 <= qVar28 / qVar29) {
        QRectF::top(in_R9);
        dVar48 = 65536.0;
        iVar16 = qCeil<double>(5.03115446276121e-317);
        qVar26 = QRectF::top(in_stack_00000008);
        local_4c0 = (int)(long)(qVar26 * dVar48) + iVar16 + -1;
      }
      else {
        QRectF::bottom(in_R9);
        iVar16 = qFloor<double>(5.03108282324256e-317);
        qVar26 = QRectF::bottom(in_stack_00000008);
        local_4c0 = (int)(long)(qVar26 * 65536.0) + iVar16 + 1;
      }
      local_4d8 = in_RDI + iVar15 * in_ESI + (long)iVar14 * 4;
      iVar14 = iVar12 * 4;
      if ((in_R8D <= (int)(local_4c0 >> 0x10)) && (iVar13 < 0)) {
        local_4c0 = iVar13 + local_4c0;
        local_4b4 = local_4b4 + -1;
      }
      if (((int)((ulong)(long)in_ECX >> 2) <= (int)(local_4bc >> 0x10)) && (iVar12 < 0)) {
        local_4bc = iVar12 + local_4bc;
        local_4b8 = local_4b8 + -1;
      }
      if (in_R8D <= (int)(local_4c0 + iVar13 * (local_4b4 + -1) >> 0x10)) {
        local_4b4 = local_4b4 + -1;
      }
      if ((int)((ulong)(long)in_ECX >> 2) <= (int)(local_4bc + iVar12 * (local_4b8 + -1) >> 0x10)) {
        local_4b8 = local_4b8 + -1;
      }
      while (local_4b4 = local_4b4 + -1, -1 < local_4b4) {
        lVar22 = in_RDX + (ulong)((local_4c0 >> 0x10) * in_ECX);
        local_554 = local_4bc;
        local_558 = 0;
        while( true ) {
          local_50 = (unsigned_long_long)local_4b8;
          local_58 = 4 - (local_4d8 >> 2 & 3) & 3;
          iVar15 = local_558;
          puVar23 = qMin<unsigned_long_long>(&local_50,&local_58);
          if ((int)*puVar23 <= iVar15) break;
          uVar32 = *(uint *)(lVar22 + (long)((int)local_554 >> 0x10) * 4);
          uVar18 = *(uint *)(local_4d8 + (long)local_558 * 4);
          uVar17 = qAlpha(uVar32 ^ 0xffffffff);
          uVar18 = BYTE_MUL(uVar18,uVar17);
          *(uint *)(local_4d8 + (long)local_558 * 4) = uVar32 + uVar18;
          local_554 = iVar12 + local_554;
          local_558 = local_558 + 1;
        }
        iVar15 = local_554 + iVar12 + iVar12;
        local_578 = CONCAT44(iVar15,iVar15 + iVar12);
        uStack_570 = CONCAT44(local_554,local_554 + iVar12);
        for (; local_558 < local_4b8 + -3; local_558 = local_558 + 4) {
          uVar32 = (uint)local_578._2_2_;
          uVar19 = (uint)local_578._6_2_;
          uVar20 = (uint)uStack_570._2_2_;
          uVar21 = (uint)uStack_570._6_2_;
          local_68 = (int)local_578;
          iStack_64 = (int)((ulong)local_578 >> 0x20);
          iStack_60 = (int)uStack_570;
          iStack_5c = (int)((ulong)uStack_570 >> 0x20);
          local_578 = CONCAT44(iStack_64 + iVar14,local_68 + iVar14);
          uStack_570 = CONCAT44(iStack_5c + iVar14,iStack_60 + iVar14);
          uVar1 = *(undefined4 *)(lVar22 + (long)(int)uVar32 * 4);
          uVar2 = *(undefined4 *)(lVar22 + (long)(int)uVar19 * 4);
          uVar3 = *(undefined4 *)(lVar22 + (long)(int)uVar20 * 4);
          uVar4 = *(undefined4 *)(lVar22 + (long)(int)uVar21 * 4);
          uVar30 = CONCAT44(uVar3,uVar4) & 0xff000000ff000000;
          uVar31 = CONCAT44(uVar1,uVar2) & 0xff000000ff000000;
          local_3c8 = (int)uVar30;
          iStack_3c4 = (int)(uVar30 >> 0x20);
          iStack_3c0 = (int)uVar31;
          iStack_3bc = (int)(uVar31 >> 0x20);
          uVar32 = -(uint)(iStack_3bc == -0x1000000);
          auVar6._4_4_ = -(uint)(iStack_3c4 == -0x1000000);
          auVar6._0_4_ = -(uint)(local_3c8 == -0x1000000);
          auVar6._8_4_ = -(uint)(iStack_3c0 == -0x1000000);
          auVar6._12_4_ = uVar32;
          if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                       (ushort)((byte)(uVar32 >> 7) & 1) << 0xc |
                       (ushort)((byte)(uVar32 >> 0xf) & 1) << 0xd |
                       (ushort)((byte)(uVar32 >> 0x17) & 1) << 0xe |
                      (ushort)(byte)(uVar32 >> 0x1f) << 0xf) == 0xffff) {
            puVar24 = (ulong *)(local_4d8 + (long)local_558 * 4);
            *puVar24 = CONCAT44(uVar3,uVar4);
            puVar24[1] = CONCAT44(uVar1,uVar2);
          }
          else {
            uVar32 = -(uint)(iStack_3bc == 0);
            auVar5._4_4_ = -(uint)(iStack_3c4 == 0);
            auVar5._0_4_ = -(uint)(local_3c8 == 0);
            auVar5._8_4_ = -(uint)(iStack_3c0 == 0);
            auVar5._12_4_ = uVar32;
            if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                         (ushort)((byte)(uVar32 >> 7) & 1) << 0xc |
                         (ushort)((byte)(uVar32 >> 0xf) & 1) << 0xd |
                         (ushort)((byte)(uVar32 >> 0x17) & 1) << 0xe |
                        (ushort)(byte)(uVar32 >> 0x1f) << 0xf) != 0xffff) {
              bVar10 = (byte)((uint)uVar3 >> 0x18);
              uStack_304 = (ushort)bVar10;
              bVar9 = (byte)((uint)uVar4 >> 0x18);
              local_308 = (ushort)bVar9;
              uStack_306 = (ushort)bVar9;
              bVar7 = (byte)((uint)uVar2 >> 0x18);
              uStack_300 = (ushort)bVar7;
              bVar8 = (byte)((uint)uVar1 >> 0x18);
              uStack_2fc = (ushort)bVar8;
              puVar24 = (ulong *)(local_4d8 + (long)local_558 * 4);
              uVar30 = *puVar24;
              uVar31 = puVar24[1];
              local_278 = (ushort)uVar30;
              uStack_276 = (ushort)(uVar30 >> 0x10);
              uStack_274 = (ushort)(uVar30 >> 0x20);
              uStack_270 = (ushort)uVar31;
              uStack_26e = (ushort)(uVar31 >> 0x10);
              uStack_26c = (ushort)(uVar31 >> 0x20);
              uVar35 = uVar30 & 0xff00ff00ff00ff;
              uVar43 = uVar31 & 0xff00ff00ff00ff;
              uVar33 = (local_278 >> 8) * (0xff - local_308);
              uVar36 = (uStack_276 >> 8) * (0xff - uStack_306);
              uVar38 = (uStack_274 >> 8) * (0xff - uStack_304);
              uVar40 = (ushort)(uVar30 >> 0x38) * 0xff;
              uVar41 = (uStack_270 >> 8) * (0xff - uStack_300);
              uVar44 = (uStack_26e >> 8) * 0xff;
              uVar45 = (uStack_26c >> 8) * (0xff - uStack_2fc);
              uVar47 = (ushort)(uVar31 >> 0x38) * 0xff;
              local_258 = (short)uVar35;
              sStack_256 = (short)(uVar35 >> 0x10);
              sStack_254 = (short)(uVar35 >> 0x20);
              sStack_252 = (short)(uVar35 >> 0x30);
              sStack_250 = (short)uVar43;
              sStack_24e = (short)(uVar43 >> 0x10);
              sStack_24c = (short)(uVar43 >> 0x20);
              sStack_24a = (short)(uVar43 >> 0x30);
              uVar34 = local_258 * (0xff - local_308);
              uVar37 = sStack_256 * (0xff - uStack_306);
              uVar39 = sStack_254 * (0xff - uStack_304);
              uVar42 = sStack_250 * (0xff - uStack_300);
              uVar46 = sStack_24c * (0xff - uStack_2fc);
              local_5e8 = CONCAT26(uVar40 + (uVar40 >> 8) + 0x80,
                                   CONCAT24(uVar38 + (uVar38 >> 8) + 0x80,
                                            CONCAT22(uVar36 + (uVar36 >> 8) + 0x80,
                                                     uVar33 + (uVar33 >> 8) + 0x80)));
              uStack_5e0 = CONCAT26(uVar47 + (uVar47 >> 8) + 0x80,
                                    CONCAT24(uVar45 + (uVar45 >> 8) + 0x80,
                                             CONCAT22(uVar44 + (uVar44 >> 8) + 0x80,
                                                      uVar41 + (uVar41 >> 8) + 0x80)));
              local_5e8 = local_5e8 & 0xff00ff00ff00ff00;
              uStack_5e0 = uStack_5e0 & 0xff00ff00ff00ff00;
              local_178 = (char)uVar4;
              cStack_177 = (char)((uint)uVar4 >> 8);
              cStack_176 = (char)((uint)uVar4 >> 0x10);
              cStack_174 = (char)uVar3;
              cStack_173 = (char)((uint)uVar3 >> 8);
              cStack_172 = (char)((uint)uVar3 >> 0x10);
              cStack_170 = (char)uVar2;
              cStack_16f = (char)((uint)uVar2 >> 8);
              cStack_16e = (char)((uint)uVar2 >> 0x10);
              cStack_16c = (char)uVar1;
              cStack_16b = (char)((uint)uVar1 >> 8);
              cStack_16a = (char)((uint)uVar1 >> 0x10);
              local_188 = (char)((ushort)(uVar34 + (uVar34 >> 8) + 0x80) >> 8);
              cStack_187 = (char)(local_5e8 >> 8);
              cStack_186 = (char)((ushort)(uVar37 + (uVar37 >> 8) + 0x80) >> 8);
              cStack_185 = (char)(local_5e8 >> 0x18);
              cStack_184 = (char)((ushort)(uVar39 + (uVar39 >> 8) + 0x80) >> 8);
              cStack_183 = (char)(local_5e8 >> 0x28);
              cStack_182 = (char)((ushort)(sStack_252 * 0xff + ((ushort)(sStack_252 * 0xff) >> 8) +
                                          0x80) >> 8);
              cStack_181 = (char)(local_5e8 >> 0x38);
              cStack_180 = (char)((ushort)(uVar42 + (uVar42 >> 8) + 0x80) >> 8);
              cStack_17f = (char)(uStack_5e0 >> 8);
              cStack_17e = (char)((ushort)(sStack_24e * 0xff + ((ushort)(sStack_24e * 0xff) >> 8) +
                                          0x80) >> 8);
              cStack_17d = (char)(uStack_5e0 >> 0x18);
              cStack_17c = (char)((ushort)(uVar46 + (uVar46 >> 8) + 0x80) >> 8);
              cStack_17b = (char)(uStack_5e0 >> 0x28);
              cStack_17a = (char)((ushort)(sStack_24a * 0xff + ((ushort)(sStack_24a * 0xff) >> 8) +
                                          0x80) >> 8);
              cStack_179 = (char)(uStack_5e0 >> 0x38);
              local_608 = CONCAT17(bVar10 + cStack_181,
                                   CONCAT16(cStack_172 + cStack_182,
                                            CONCAT15(cStack_173 + cStack_183,
                                                     CONCAT14(cStack_174 + cStack_184,
                                                              CONCAT13(bVar9 + cStack_185,
                                                                       CONCAT12(cStack_176 +
                                                                                cStack_186,
                                                                                CONCAT11(cStack_177
                                                                                         + 
                                                  cStack_187,local_178 + local_188)))))));
              uStack_600 = CONCAT17(bVar8 + cStack_179,
                                    CONCAT16(cStack_16a + cStack_17a,
                                             CONCAT15(cStack_16b + cStack_17b,
                                                      CONCAT14(cStack_16c + cStack_17c,
                                                               CONCAT13(bVar7 + cStack_17d,
                                                                        CONCAT12(cStack_16e +
                                                                                 cStack_17e,
                                                                                 CONCAT11(cStack_16f
                                                                                          + 
                                                  cStack_17f,cStack_170 + cStack_180)))))));
              puVar25 = (undefined8 *)(local_4d8 + (long)local_558 * 4);
              *puVar25 = local_608;
              puVar25[1] = uStack_600;
            }
          }
        }
        for (local_60c = 0; local_60c < 3 && local_558 < local_4b8; local_60c = local_60c + 1) {
          uVar32 = *(uint *)(lVar22 + (ulong)(local_4bc + local_558 * iVar12 >> 0x10) * 4);
          uVar18 = *(uint *)(local_4d8 + (long)local_558 * 4);
          uVar17 = qAlpha(uVar32 ^ 0xffffffff);
          uVar18 = BYTE_MUL(uVar18,uVar17);
          *(uint *)(local_4d8 + (long)local_558 * 4) = uVar32 + uVar18;
          local_558 = local_558 + 1;
        }
        local_4d8 = local_4d8 + (long)in_ESI;
        local_4c0 = iVar13 + local_4c0;
      }
    }
  }
  else {
    qt_scale_image_argb32_on_argb32
              (in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
               (uchar *)CONCAT26(in_stack_fffffffffffff99e,
                                 CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
               in_stack_fffffffffffff994,in_stack_fffffffffffff990,
               (QRectF *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               in_stack_fffffffffffff9d0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_scale_image_argb32_on_argb32_sse2(uchar *destPixels, int dbpl,
                                          const uchar *srcPixels, int sbpl, int srch,
                                          const QRectF &targetRect,
                                          const QRectF &sourceRect,
                                          const QRect &clip,
                                          int const_alpha)
{
    if (const_alpha != 256) {
        // from qblendfunctions.cpp
        extern void qt_scale_image_argb32_on_argb32(uchar *destPixels, int dbpl,
                                               const uchar *srcPixels, int sbpl, int srch,
                                               const QRectF &targetRect,
                                               const QRectF &sourceRect,
                                               const QRect &clip,
                                               int const_alpha);
        return qt_scale_image_argb32_on_argb32(destPixels, dbpl, srcPixels, sbpl, srch, targetRect, sourceRect, clip, const_alpha);
    }

    qreal sx = sourceRect.width() / (qreal)targetRect.width();
    qreal sy = sourceRect.height() / (qreal)targetRect.height();

    const int ix = 0x00010000 * sx;
    const int iy = 0x00010000 * sy;

    QRect tr = targetRect.normalized().toRect();
    tr = tr.intersected(clip);
    if (tr.isEmpty())
        return;
    const int tx1 = tr.left();
    const int ty1 = tr.top();
    int h = tr.height();
    int w = tr.width();

    quint32 basex;
    quint32 srcy;

    if (sx < 0) {
        int dstx = qFloor((tx1 + qreal(0.5) - targetRect.right()) * sx * 65536) + 1;
        basex = quint32(sourceRect.right() * 65536) + dstx;
    } else {
        int dstx = qCeil((tx1 + qreal(0.5) - targetRect.left()) * sx * 65536) - 1;
        basex = quint32(sourceRect.left() * 65536) + dstx;
    }
    if (sy < 0) {
        int dsty = qFloor((ty1 + qreal(0.5) - targetRect.bottom()) * sy * 65536) + 1;
        srcy = quint32(sourceRect.bottom() * 65536) + dsty;
    } else {
        int dsty = qCeil((ty1 + qreal(0.5) - targetRect.top()) * sy * 65536) - 1;
        srcy = quint32(sourceRect.top() * 65536) + dsty;
    }

    quint32 *dst = ((quint32 *) (destPixels + ty1 * dbpl)) + tx1;

    const __m128i nullVector = _mm_setzero_si128();
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i ixVector = _mm_set1_epi32(4*ix);

    // this bounds check here is required as floating point rounding above might in some cases lead to
    // w/h values that are one pixel too large, falling outside of the valid image area.
    const int ystart = srcy >> 16;
    if (ystart >= srch && iy < 0) {
        srcy += iy;
        --h;
    }
    const int xstart = basex >> 16;
    if (xstart >=  (int)(sbpl/sizeof(quint32)) && ix < 0) {
        basex += ix;
        --w;
    }
    int yend = (srcy + iy * (h - 1)) >> 16;
    if (yend < 0 || yend >= srch)
        --h;
    int xend = (basex + ix * (w - 1)) >> 16;
    if (xend < 0 || xend >= (int)(sbpl/sizeof(quint32)))
        --w;

    while (--h >= 0) {
        const uint *src = (const quint32 *) (srcPixels + (srcy >> 16) * sbpl);
        int srcx = basex;
        int x = 0;

        ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
            uint s = src[srcx >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
            srcx += ix;
        }

        __m128i srcxVector = _mm_set_epi32(srcx, srcx + ix, srcx + ix + ix, srcx + ix + ix + ix);

        for (; x < (w - 3); x += 4) {
            const int idx0 = _mm_extract_epi16(srcxVector, 1);
            const int idx1 = _mm_extract_epi16(srcxVector, 3);
            const int idx2 = _mm_extract_epi16(srcxVector, 5);
            const int idx3 = _mm_extract_epi16(srcxVector, 7);
            srcxVector = _mm_add_epi32(srcxVector, ixVector);

            const __m128i srcVector = _mm_set_epi32(src[idx0], src[idx1], src[idx2], src[idx3]);
            BLEND_SOURCE_OVER_ARGB32_SSE2_helper(dst, srcVector, nullVector, half, one, colorMask, alphaMask);
        }

        SIMD_EPILOGUE(x, w, 3) {
            uint s = src[(basex + x*ix) >> 16];
            dst[x] = s + BYTE_MUL(dst[x], qAlpha(~s));
        }
        dst = (quint32 *)(((uchar *) dst) + dbpl);
        srcy += iy;
    }
}